

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpkview.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  _Bool _Var2;
  int *piVar3;
  char *pcVar4;
  CLU *clu_00;
  char *pcVar5;
  undefined8 uVar6;
  SDL_Surface *checkerboard_surf;
  CLU *clu;
  FILE *pFStack_38;
  LPStatus status;
  FILE *clu_fp;
  char *clu_path;
  undefined4 local_20;
  undefined4 uStack_1c;
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  app.which_entry = 0;
  app.xpk_path = (char *)0x0;
  app.xpk_fp = (FILE *)0x0;
  app.checkerboard_rgba = (uint8_t *)0x0;
  app.xpk = (XPK *)0x0;
  app.xpkentry = (XPKEntry *)0x0;
  app.xpkentry_tx = (SDL_Texture *)0x0;
  clu_path._0_4_ = 0;
  clu_path._4_4_ = 0;
  local_20 = 0;
  uStack_1c = 0;
  app.entry_rect.x = 0;
  app.entry_rect.y = 0;
  app.entry_rect.w = 0;
  app.entry_rect.h = 0;
  app.centered = false;
  app.checkerboard_on = true;
  local_18 = argv;
  argv_local._0_4_ = argc;
  if (argc < 3) {
    LPWarn("xpkview","usage: xpkview clufile xpkfile");
  }
  else {
    clu_fp = (FILE *)argv[1];
    app.xpk_path = argv[2];
    pFStack_38 = fopen((char *)clu_fp,"rb");
    pFVar1 = clu_fp;
    if (pFStack_38 == (FILE *)0x0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      LPWarn("xpkview","couldn\'t open CLU file: %s: %s",pFVar1,pcVar4);
    }
    else {
      clu_00 = CLU_NewFromFile((FILE *)pFStack_38,(LPStatus *)((long)&clu + 4));
      pFVar1 = clu_fp;
      if (clu._4_4_ == LUNAPURPURA_OK) {
        app.xpk_fp = (FILE *)fopen(app.xpk_path,"rb");
        pcVar4 = app.xpk_path;
        if ((FILE *)app.xpk_fp == (FILE *)0x0) {
          piVar3 = __errno_location();
          pcVar5 = strerror(*piVar3);
          LPWarn("xpkview","couldn\'t open XPK file: %s: %s",pcVar4,pcVar5);
        }
        else {
          app.xpk = XPK_NewFromFile(app.xpk_fp,(LPStatus *)((long)&clu + 4));
          pcVar4 = app.xpk_path;
          if (clu._4_4_ == LUNAPURPURA_OK) {
            XPK_AttachCLU(app.xpk,clu_00);
            _Var2 = XPKView_Setup();
            if ((_Var2) && (_Var2 = XPKView_CreateCheckerboardPattern(), _Var2)) {
              XPKView_LoadXPKEntry();
              uVar6 = SDL_CreateRGBSurfaceWithFormatFrom
                                (app.checkerboard_rgba,0x20,0x20,0x20,0x80,0x16762004);
              free(app.checkerboard_rgba);
              app.checkerboard_tx = (SDL_Texture *)SDL_CreateTextureFromSurface(app.renderer,uVar6);
              SDL_FreeSurface(uVar6);
              _Var2 = XPKView_MainLoop();
              if (_Var2) {
                XPKView_Shutdown();
                return 0;
              }
            }
          }
          else {
            pcVar5 = LPStatusString(clu._4_4_);
            LPWarn("xpkview","couldn\'t open XPK file: %s: %s",pcVar4,pcVar5);
          }
        }
      }
      else {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        LPWarn("xpkview","couldn\'t open CLU file: %s: %s",pFVar1,pcVar4);
      }
    }
  }
  XPKView_Shutdown();
  return 1;
}

Assistant:

int
main(int argc, char *argv[])
{
	app.which_entry = 0;
	app.xpk_path = NULL;
	app.xpk_fp = NULL;
	app.checkerboard_rgba = NULL;
	app.xpk = NULL;
	app.xpkentry = NULL;
	app.xpkentry_tx = NULL;
	app.entry_rect = (SDL_Rect){0, 0, 0, 0};
	app.centered = false;
	app.checkerboard_on = true;

	if (argc < 3) {
		LPWarn(MSGPREFIX, "usage: xpkview clufile xpkfile");
		goto fail;
	}

	char *clu_path = argv[1];
	app.xpk_path = argv[2];

	FILE *clu_fp = fopen(clu_path, "rb");
	if (!clu_fp) {
		LPWarn(MSGPREFIX, "couldn't open CLU file: %s: %s", clu_path, strerror(errno));
		goto fail;
	}

	LPStatus status;

	CLU *clu = CLU_NewFromFile(clu_fp, &status);
	if (status != LUNAPURPURA_OK) {
		LPWarn(MSGPREFIX, "couldn't open CLU file: %s: %s", clu_path, strerror(errno));
		goto fail;
	}

	app.xpk_fp = fopen(app.xpk_path, "rb");
	if (!app.xpk_fp) {
		LPWarn(MSGPREFIX, "couldn't open XPK file: %s: %s", app.xpk_path, strerror(errno));
		goto fail;
	}

	app.xpk = XPK_NewFromFile(app.xpk_fp, &status);
	if (status != LUNAPURPURA_OK) {
		LPWarn(MSGPREFIX, "couldn't open XPK file: %s: %s", app.xpk_path, LPStatusString(status));
		goto fail;
	}

	XPK_AttachCLU(app.xpk, clu);

	if (!XPKView_Setup()) {
		goto fail;
	}

	if (!XPKView_CreateCheckerboardPattern()) {
		goto fail;
	}

	XPKView_LoadXPKEntry();

	/* Obtain the checkerboard texture. */
	SDL_Surface *checkerboard_surf = SDL_CreateRGBSurfaceWithFormatFrom(
		app.checkerboard_rgba, 32, 32, 32, 32*4, SDL_PIXELFORMAT_RGBA32
	);
	free(app.checkerboard_rgba);
	app.checkerboard_tx = SDL_CreateTextureFromSurface(app.renderer, checkerboard_surf);
	SDL_FreeSurface(checkerboard_surf);

	if (!XPKView_MainLoop()) {
		goto fail;
	}

	XPKView_Shutdown();
	return EXIT_SUCCESS;

fail:
	XPKView_Shutdown();
	return EXIT_FAILURE;
}